

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateStaticVariableInitializers
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  mapped_type *pmVar2;
  long *plVar3;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  char *text;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_00;
  long lVar4;
  int i;
  long lVar5;
  allocator<char> local_a1;
  key_type local_a0;
  string local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  
  if (*(int *)(*(long *)(*(long *)((_anonymous_namespace_ *)this->descriptor_ + 0x10) + 0x88) + 0x50
              ) != 3) {
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vars._M_t._M_impl.super__Rb_tree_header._M_header;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (anonymous_namespace)::UniqueFileScopeIdentifier_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)this->descriptor_,in_RDX);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"identifier",&local_a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    pDVar1 = this->descriptor_;
    plVar3 = (long *)(*(long *)(pDVar1 + 0x10) + 0x50);
    if (*(long *)(pDVar1 + 0x18) != 0) {
      plVar3 = (long *)(*(long *)(pDVar1 + 0x18) + 0x40);
    }
    SimpleItoa_abi_cxx11_
              (&local_80,(protobuf *)(((long)pDVar1 - *plVar3) / 0x78 & 0xffffffff),
               (int)(((long)pDVar1 - *plVar3) % 0x78));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"index",&local_a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    ClassName_abi_cxx11_(&local_80,(java *)this->descriptor_,descriptor);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"classname",&local_a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    if (*(_anonymous_namespace_ **)(this->descriptor_ + 0x18) == (_anonymous_namespace_ *)0x0) {
      text = 
      "internal_$identifier$_descriptor =\n  getDescriptor().getMessageTypes().get($index$);\n";
    }
    else {
      (anonymous_namespace)::UniqueFileScopeIdentifier_abi_cxx11_
                (&local_80,*(_anonymous_namespace_ **)(this->descriptor_ + 0x18),descriptor_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"parent",&local_a1);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      text = 
      "internal_$identifier$_descriptor =\n  internal_$parent$_descriptor.getNestedTypes().get($index$);\n"
      ;
      if (*(long *)(this->descriptor_ + 0x18) == 0) {
        text = 
        "internal_$identifier$_descriptor =\n  getDescriptor().getMessageTypes().get($index$);\n";
      }
    }
    io::Printer::Print(printer,&vars,text);
    io::Printer::Print(printer,&vars,
                       "internal_$identifier$_fieldAccessorTable = new\n  com.google.protobuf.GeneratedMessage.FieldAccessorTable(\n    internal_$identifier$_descriptor,\n    new java.lang.String[] { "
                      );
    lVar4 = 0;
    field = extraout_RDX;
    for (lVar5 = 0; lVar5 < *(int *)(this->descriptor_ + 0x2c); lVar5 = lVar5 + 1) {
      UnderscoresToCapitalizedCamelCase_abi_cxx11_
                (&local_80,(java *)(*(long *)(this->descriptor_ + 0x30) + lVar4),field);
      io::Printer::Print(printer,"\"$field_name$\", ","field_name",&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      lVar4 = lVar4 + 0x78;
      field = extraout_RDX_00;
    }
    io::Printer::Print(printer,"});\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&vars._M_t);
  }
  lVar5 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(this->descriptor_ + 0x38); lVar4 = lVar4 + 1) {
    MessageGenerator((MessageGenerator *)&vars,
                     (Descriptor *)(*(long *)(this->descriptor_ + 0x40) + lVar5));
    GenerateStaticVariableInitializers((MessageGenerator *)&vars,printer);
    FieldGeneratorMap::~FieldGeneratorMap
              ((FieldGeneratorMap *)&vars._M_t._M_impl.super__Rb_tree_header);
    lVar5 = lVar5 + 0x78;
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_)) {
    map<string, string> vars;
    vars["identifier"] = UniqueFileScopeIdentifier(descriptor_);
    vars["index"] = SimpleItoa(descriptor_->index());
    vars["classname"] = ClassName(descriptor_);
    if (descriptor_->containing_type() != NULL) {
      vars["parent"] = UniqueFileScopeIdentifier(
          descriptor_->containing_type());
    }

    // The descriptor for this type.
    if (descriptor_->containing_type() == NULL) {
      printer->Print(vars,
        "internal_$identifier$_descriptor =\n"
        "  getDescriptor().getMessageTypes().get($index$);\n");
    } else {
      printer->Print(vars,
        "internal_$identifier$_descriptor =\n"
        "  internal_$parent$_descriptor.getNestedTypes().get($index$);\n");
    }

    // And the FieldAccessorTable.
    printer->Print(vars,
      "internal_$identifier$_fieldAccessorTable = new\n"
      "  com.google.protobuf.GeneratedMessage.FieldAccessorTable(\n"
      "    internal_$identifier$_descriptor,\n"
      "    new java.lang.String[] { ");
    for (int i = 0; i < descriptor_->field_count(); i++) {
      printer->Print(
        "\"$field_name$\", ",
        "field_name",
          UnderscoresToCapitalizedCamelCase(descriptor_->field(i)));
    }
    printer->Print(
        "});\n");
  }

  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    MessageGenerator(descriptor_->nested_type(i))
      .GenerateStaticVariableInitializers(printer);
  }
}